

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

void parasail_close(parasail_file_t *pf)

{
  int iVar1;
  parasail_file_t *pf_local;
  
  if (pf == (parasail_file_t *)0x0) {
    fprintf(_stderr,"parasail_close: NULL file\n");
  }
  else {
    iVar1 = munmap(pf->buf,pf->size);
    if (iVar1 == -1) {
      perror("munmap");
      fprintf(_stderr,"parasail_close: cannot munmap file buffer\n");
    }
    iVar1 = close(pf->fd);
    if (iVar1 == -1) {
      perror("close");
      fprintf(_stderr,"parasail_close: cannot close file descriptor\n");
    }
    free(pf);
  }
  return;
}

Assistant:

void parasail_close(parasail_file_t *pf)
{
    if (NULL == pf) {
        fprintf(stderr, "parasail_close: NULL file\n");
        return;
    }
#if defined(HAVE_SYS_MMAN_H)
    if (-1 == munmap((void*)pf->buf, pf->size)) {
        perror("munmap");
        fprintf(stderr, "parasail_close: cannot munmap file buffer\n");
    }
    if (-1 == close(pf->fd)) {
        perror("close");
        fprintf(stderr, "parasail_close: cannot close file descriptor\n");
    }
#else
    free((void*)pf->buf);
    /* file was already closed */
#endif
    free(pf);
}